

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_var_tests.cpp
# Opt level: O0

void __thiscall iu_FlagTest_x_iutest_x_Check_Test::Body(iu_FlagTest_x_iutest_x_Check_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  Fragment<2> *b;
  Fragment<16> *b_00;
  Fragment<64> *b_01;
  Fragment<1> *b_02;
  Fragment<8192> *b_03;
  Fragment<128> *b_04;
  char *pcVar4;
  RepeatCountSet *val2;
  type **in_stack_ffffffffffffe1d8;
  AssertionHelper local_1c20;
  Fixed local_1bf0;
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
  local_1a68;
  undefined1 local_1a48 [8];
  AssertionResult iutest_ar_13;
  Fixed local_19f0;
  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> local_1868;
  undefined1 local_1848 [8];
  AssertionResult iutest_ar_12;
  Fixed local_17f0;
  RepeatCountSet local_1665;
  char local_1664 [4];
  undefined1 local_1660 [8];
  AssertionResult iutest_ar_11;
  Fixed local_1608;
  RandomSeedSet local_147d;
  char local_147c [4];
  undefined1 local_1478 [8];
  AssertionResult iutest_ar_10;
  AssertionHelper local_1430;
  Fixed local_1400;
  undefined1 local_1271;
  undefined1 local_1270 [8];
  AssertionResult iutest_ar_9;
  AssertionHelper local_1228;
  Fixed local_11f8;
  undefined1 local_1069;
  undefined1 local_1068 [8];
  AssertionResult iutest_ar_8;
  Fixed local_1010;
  OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
  local_e88;
  undefined1 local_e68 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_e20;
  Fixed local_df0;
  Fragment<4096> local_c62;
  bool local_c61;
  undefined1 local_c60 [8];
  AssertionResult iutest_ar_6;
  AssertionHelper local_c18;
  Fixed local_be8;
  Fragment<196608> local_a5a;
  bool local_a59;
  undefined1 local_a58 [8];
  AssertionResult iutest_ar_5;
  AssertionHelper local_a10;
  Fixed local_9e0;
  undefined1 local_851;
  undefined1 local_850 [8];
  AssertionResult iutest_ar_4;
  AssertionHelper local_808;
  Fixed local_7d8;
  undefined1 local_649;
  undefined1 local_648 [8];
  AssertionResult iutest_ar_3;
  AssertionHelper local_600;
  Fixed local_5d0;
  undefined1 local_441;
  undefined1 local_440 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_3f8;
  Fixed local_3c8;
  undefined1 local_239;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_FlagTest_x_iutest_x_Check_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  pcVar4 = (char *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::EqHelper<true>::Compare<int,int_volatile>
            ((AssertionResult *)local_38,(EqHelper<true> *)0x14d5ed,"g_result.setup_environment",
             local_3c,&g_result.setup_environment,(int *)&iutest_type_traits::enabler_t<void>::value
             ,in_stack_ffffffffffffe1d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,(char (*) [2])0x14f36e);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(pFVar2,lasterror);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(pFVar2,(char (*) [3])0x14d652);
    pcVar3 = strerror(lasterror);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(pFVar2,pcVar3);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
               ,0x44,pcVar3,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_208,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<2>::Fragment((Fragment<2> *)&local_239);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<2>>
              ((AssertionResult *)local_238,(AssertionResult *)&local_239,b);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_2.m_result,(internal *)local_238,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(also_run_disabled_tests)","false","true",
                 pcVar4);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x45,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_3f8,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<16>::Fragment((Fragment<16> *)&local_441);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<16>>
              ((AssertionResult *)local_440,(AssertionResult *)&local_441,b_00);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
    if (!bVar1) {
      memset(&local_5d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_3.m_result,(internal *)local_440,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(break_on_failure)","false","true",pcVar4)
      ;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_600,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x46,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_600,&local_5d0);
      iutest::AssertionHelper::~AssertionHelper(&local_600);
      std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_440);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<64>::Fragment((Fragment<64> *)&local_649);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<64>>
              ((AssertionResult *)local_648,(AssertionResult *)&local_649,b_01);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar1) {
      memset(&local_7d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7d8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_4.m_result,(internal *)local_648,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(throw_on_failure)","false","true",pcVar4)
      ;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_808,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x47,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_808,&local_7d8);
      iutest::AssertionHelper::~AssertionHelper(&local_808);
      std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<1>::Fragment((Fragment<1> *)&local_851);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<1>>
              ((AssertionResult *)local_850,(AssertionResult *)&local_851,b_02);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
    if (!bVar1) {
      memset(&local_9e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_9e0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_5.m_result,(internal *)local_850,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(shuffle)","false","true",pcVar4);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_a10,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x48,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_a10,&local_9e0);
      iutest::AssertionHelper::~AssertionHelper(&local_a10);
      std::__cxx11::string::~string((string *)&iutest_ar_5.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_9e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_850);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<196608>::Fragment(&local_a5a);
    local_a59 = iutest::TestFlag::Fragment::operator_cast_to_bool((Fragment *)&local_a5a);
    local_a59 = !local_a59;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_a58,&local_a59);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
    if (!bVar1) {
      memset(&local_be8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_be8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_6.m_result,(internal *)local_a58,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(catch_exceptions)","true","false",pcVar4)
      ;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_c18,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x49,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_c18,&local_be8);
      iutest::AssertionHelper::~AssertionHelper(&local_c18);
      std::__cxx11::string::~string((string *)&iutest_ar_6.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_be8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<4096>::Fragment(&local_c62);
    local_c61 = iutest::TestFlag::Fragment::operator_cast_to_bool((Fragment *)&local_c62);
    local_c61 = !local_c61;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_c60,&local_c61);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
    if (!bVar1) {
      memset(&local_df0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_df0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_7.m_result,(internal *)local_c60,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(print_time)","true","false",pcVar4);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_e20,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4a,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_e20,&local_df0);
      iutest::AssertionHelper::~AssertionHelper(&local_e20);
      std::__cxx11::string::~string((string *)&iutest_ar_7.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_df0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
    iutest::detail::AlwaysZero();
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
    ::OptionString(&local_e88);
    pcVar4 = iutest::TestEnv::
             OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
             ::c_str(&local_e88);
    val2 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_e68,(internal *)"\"env_var\"",
               "::iutest::TestEnv::default_package_name().c_str()","env_var",pcVar4,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffe1d8);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
    ::~OptionString(&local_e88);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e68);
    if (!bVar1) {
      memset(&local_1010,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1010);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_e68);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_8.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4c,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_1010);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1010);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_e68);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<8192>::Fragment((Fragment<8192> *)&local_1069);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<8192>>
              ((AssertionResult *)local_1068,(AssertionResult *)&local_1069,b_03);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
    if (!bVar1) {
      memset(&local_11f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_11f8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_9.m_result,(internal *)local_1068,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(file_location_style_msvc)","false","true"
                 ,(char *)val2);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_1228,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4d,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_1228,&local_11f8);
      iutest::AssertionHelper::~AssertionHelper(&local_1228);
      std::__cxx11::string::~string((string *)&iutest_ar_9.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_11f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
    iutest::detail::AlwaysZero();
    iutest::TestFlag::Fragment<128>::Fragment((Fragment<128> *)&local_1271);
    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<128>>
              ((AssertionResult *)local_1270,(AssertionResult *)&local_1271,b_04);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1270);
    if (!bVar1) {
      memset(&local_1400,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1400);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_10.m_result,(internal *)local_1270,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(warning_into_error)","false","true",
                 (char *)val2);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_1430,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4e,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_1430,&local_1400);
      iutest::AssertionHelper::~AssertionHelper(&local_1430);
      std::__cxx11::string::~string((string *)&iutest_ar_10.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1400);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1270);
    iutest::detail::AlwaysZero();
    local_147c[0] = -0x38;
    local_147c[1] = '\0';
    local_147c[2] = '\0';
    local_147c[3] = '\0';
    iutest::TestEnv::RandomSeedSet::RandomSeedSet(&local_147d);
    iutest::internal::backward::EqHelper<false>::
    Compare<unsigned_int,iutest::TestEnv::RandomSeedSet>
              ((AssertionResult *)local_1478,(EqHelper<false> *)"200u",
               "::iutest::TestEnv::random_seed()",local_147c,(uint *)&local_147d,
               (RandomSeedSet *)val2);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1478);
    if (!bVar1) {
      memset(&local_1608,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1608);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1478);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_11.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x51,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_11.m_result,&local_1608);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_11.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1608);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1478);
    iutest::detail::AlwaysZero();
    local_1664[0] = '\x02';
    local_1664[1] = '\0';
    local_1664[2] = '\0';
    local_1664[3] = '\0';
    iutest::TestEnv::RepeatCountSet::RepeatCountSet(&local_1665);
    iutest::internal::backward::EqHelper<false>::Compare<int,iutest::TestEnv::RepeatCountSet>
              ((AssertionResult *)local_1660,(EqHelper<false> *)0x14d1f1,
               "::iutest::TestEnv::repeat()",local_1664,(int *)&local_1665,val2);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1660);
    if (!bVar1) {
      memset(&local_17f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_17f0);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1660);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_12.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x52,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_12.m_result,&local_17f0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_12.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_17f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1660);
    iutest::detail::AlwaysZero();
    iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
    ::OptionString(&local_1868);
    pcVar4 = iutest::TestEnv::
             OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::c_str
                       (&local_1868);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_1848,(internal *)"\"Flag*\"",
               "::iutest::TestEnv::filter().c_str()","Flag*",pcVar4,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffe1d8);
    iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
    ::~OptionString(&local_1868);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1848);
    if (!bVar1) {
      memset(&local_19f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_19f0);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1848);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_13.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x54,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_13.m_result,&local_19f0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_13.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_19f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1848);
    iutest::detail::AlwaysZero();
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
    OptionString(&local_1a68);
    pcVar4 = iutest::TestEnv::
             OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             ::c_str(&local_1a68);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_1a48,(internal *)"\"test\"",
               "::iutest::TestEnv::output().c_str()","test",pcVar4,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffe1d8);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
    ~OptionString(&local_1a68);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a48);
    if (!bVar1) {
      memset(&local_1bf0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1bf0);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1a48);
      iutest::AssertionHelper::AssertionHelper
                (&local_1c20,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x55,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_1c20,&local_1bf0);
      iutest::AssertionHelper::~AssertionHelper(&local_1c20);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1bf0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1a48);
  }
  return;
}

Assistant:

IUTEST(FlagTest, Check)
{
    IUTEST_ASSUME_EQ(0, g_result.setup_environment) << "\n" << lasterror << ": " << strerror(lasterror);  // putenv に失敗した場合はテストしない
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(also_run_disabled_tests) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(break_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(throw_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(shuffle) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(catch_exceptions) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(print_time) );
#if !defined(IUTEST_USE_GTEST)
    IUTEST_EXPECT_STREQ( "env_var", ::iutest::IUTEST_FLAG(default_package_name).c_str() );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(file_location_style_msvc) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(warning_into_error) );
#endif

    IUTEST_EXPECT_EQ( 200u, ::iutest::IUTEST_FLAG(random_seed) );
    IUTEST_EXPECT_EQ(   2 , ::iutest::IUTEST_FLAG(repeat) );

    IUTEST_EXPECT_STREQ( "Flag*", ::iutest::IUTEST_FLAG(filter).c_str() );
    IUTEST_EXPECT_STREQ( "test", ::iutest::IUTEST_FLAG(output).c_str() );
}